

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d.c
# Opt level: O1

int envy_bios_parse_bit_d(envy_bios *bios,envy_bios_bit_entry *bit)

{
  byte bVar1;
  uint8_t *puVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  envy_bios_d_dp_info_entry *peVar14;
  envy_bios_d_dp_info_before_link_speed *peVar15;
  ulong uVar16;
  long lVar17;
  envy_bios_d_dp_info_level_entry_table *peVar18;
  envy_bios_d_dp_info_level_entry *peVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  bool bVar26;
  
  (bios->d).bit = bit;
  uVar23 = 0;
  do {
    iVar5 = parse_at(bios,uVar23,(char **)0x0);
    uVar23 = uVar23 + 1;
  } while (iVar5 == 0);
  uVar4 = (bios->d).dp_info.offset;
  if (uVar4 != 0) {
    if ((uint)uVar4 < bios->length) {
      (bios->d).dp_info.version = bios->data[(uint)uVar4];
    }
    else {
      (bios->d).dp_info.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    bVar1 = (bios->d).dp_info.version;
    if (bVar1 - 0x40 < 2) {
      lVar20 = (ulong)(bios->d).dp_info.offset + 1;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.hlen = bios->data[lVar20];
        uVar23 = 0;
      }
      else {
        (bios->d).dp_info.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar23 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 2;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.rlen = bios->data[lVar20];
        uVar13 = 0;
      }
      else {
        (bios->d).dp_info.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar13 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 3;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.entriesnum = bios->data[lVar20];
        uVar25 = 0;
      }
      else {
        (bios->d).dp_info.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar25 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 4;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.target_size = bios->data[lVar20];
        uVar6 = 0;
      }
      else {
        (bios->d).dp_info.target_size = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar6 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 5;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.levelentrytables_count = bios->data[lVar20];
        uVar7 = 0;
      }
      else {
        (bios->d).dp_info.levelentrytables_count = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar7 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 6;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.levelentry_size = bios->data[lVar20];
        uVar8 = 0;
      }
      else {
        (bios->d).dp_info.levelentry_size = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar8 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 7;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.levelentry_count = bios->data[lVar20];
        uVar9 = 0;
      }
      else {
        (bios->d).dp_info.levelentry_count = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar9 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 8;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.flags = bios->data[lVar20];
        uVar22 = 0;
      }
      else {
        (bios->d).dp_info.flags = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar22 = 0xfffffff2;
      }
      uVar22 = uVar13 | uVar23 | uVar25 | uVar6 | uVar7 | uVar8 | uVar9 | uVar22;
      (bios->d).dp_info.regular_vswing = 0;
      (bios->d).dp_info.low_vswing = 0;
    }
    else {
      if (bVar1 != 0x42) {
        fprintf(_stderr,"Unknown d DP INFO table version 0x%x\n");
        return 0;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 1;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.hlen = bios->data[lVar20];
        uVar23 = 0;
      }
      else {
        (bios->d).dp_info.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar23 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 2;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.rlen = bios->data[lVar20];
        uVar13 = 0;
      }
      else {
        (bios->d).dp_info.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar13 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 3;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.entriesnum = bios->data[lVar20];
        uVar25 = 0;
      }
      else {
        (bios->d).dp_info.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar25 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 4;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.target_size = bios->data[lVar20];
        uVar6 = 0;
      }
      else {
        (bios->d).dp_info.target_size = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar6 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 5;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.levelentrytables_count = bios->data[lVar20];
        uVar7 = 0;
      }
      else {
        (bios->d).dp_info.levelentrytables_count = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar7 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 6;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.levelentry_size = bios->data[lVar20];
        uVar8 = 0;
      }
      else {
        (bios->d).dp_info.levelentry_size = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar8 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 7;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.levelentry_count = bios->data[lVar20];
        uVar9 = 0;
      }
      else {
        (bios->d).dp_info.levelentry_count = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar9 = 0xfffffff2;
      }
      lVar20 = (ulong)(bios->d).dp_info.offset + 8;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.flags = bios->data[lVar20];
        uVar10 = 0;
      }
      else {
        (bios->d).dp_info.flags = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar10 = 0xfffffff2;
      }
      uVar21 = (ulong)(bios->d).dp_info.offset;
      lVar20 = uVar21 + 10;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.regular_vswing = CONCAT11(bios->data[lVar20],bios->data[uVar21 + 9]);
        uVar11 = 0;
      }
      else {
        (bios->d).dp_info.regular_vswing = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar11 = 0xfffffff2;
      }
      uVar21 = (ulong)(bios->d).dp_info.offset;
      lVar20 = uVar21 + 0xc;
      if ((uint)lVar20 < bios->length) {
        (bios->d).dp_info.low_vswing = CONCAT11(bios->data[lVar20],bios->data[uVar21 + 0xb]);
        uVar22 = 0;
      }
      else {
        (bios->d).dp_info.low_vswing = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar22 = 0xfffffff2;
      }
      uVar22 = uVar13 | uVar23 | uVar25 | uVar6 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar22;
    }
    (bios->d).dp_info.valid = uVar22 == 0;
    bVar1 = (bios->d).dp_info.entriesnum;
    peVar14 = (envy_bios_d_dp_info_entry *)malloc((ulong)((uint)bVar1 * 8) * 5);
    (bios->d).dp_info.entries = peVar14;
    if (bVar1 != 0) {
      uVar21 = 0;
      do {
        peVar14 = (bios->d).dp_info.entries + uVar21;
        uVar23 = (int)uVar21 * (uint)(bios->d).dp_info.rlen +
                 (uint)(bios->d).dp_info.hlen + *(int *)&(bios->d).dp_info & 0xffff;
        if (uVar23 + 1 < bios->length) {
          peVar14->offset = *(uint16_t *)(bios->data + uVar23);
        }
        else {
          peVar14->offset = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        }
        uVar4 = peVar14->offset;
        if (uVar4 != 0) {
          if ((uint)((ulong)uVar4 + 3) < bios->length) {
            puVar2 = bios->data;
            peVar14->key = CONCAT13(puVar2[(ulong)uVar4 + 3],
                                    CONCAT12(puVar2[(ulong)uVar4 + 2],
                                             *(undefined2 *)(puVar2 + uVar4)));
            uVar23 = 0;
          }
          else {
            peVar14->key = 0;
            fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
            uVar23 = 0xfffffff2;
          }
          lVar20 = (ulong)peVar14->offset + 4;
          if ((uint)lVar20 < bios->length) {
            peVar14->flags = bios->data[lVar20];
            uVar13 = 0;
          }
          else {
            peVar14->flags = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            uVar13 = 0xfffffff2;
          }
          lVar20 = (ulong)peVar14->offset + 6;
          if ((uint)lVar20 < bios->length) {
            peVar14->before_link_training =
                 CONCAT11(bios->data[lVar20],bios->data[(ulong)peVar14->offset + 5]);
            uVar25 = 0;
          }
          else {
            peVar14->before_link_training = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            uVar25 = 0xfffffff2;
          }
          lVar20 = (ulong)peVar14->offset + 8;
          if ((uint)lVar20 < bios->length) {
            peVar14->after_link_training =
                 CONCAT11(bios->data[lVar20],bios->data[(ulong)peVar14->offset + 7]);
            uVar6 = 0;
          }
          else {
            peVar14->after_link_training = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            uVar6 = 0xfffffff2;
          }
          lVar20 = (ulong)peVar14->offset + 10;
          if ((uint)lVar20 < bios->length) {
            peVar14->before_link_speed_0 =
                 CONCAT11(bios->data[lVar20],bios->data[(ulong)peVar14->offset + 9]);
            uVar7 = 0;
          }
          else {
            peVar14->before_link_speed_0 = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            uVar7 = 0xfffffff2;
          }
          lVar20 = (ulong)peVar14->offset + 0xc;
          if ((uint)lVar20 < bios->length) {
            peVar14->enable_spread =
                 CONCAT11(bios->data[lVar20],bios->data[(ulong)peVar14->offset + 0xb]);
            uVar8 = 0;
          }
          else {
            peVar14->enable_spread = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            uVar8 = 0xfffffff2;
          }
          lVar20 = (ulong)peVar14->offset + 0xe;
          if ((uint)lVar20 < bios->length) {
            peVar14->disable_spread =
                 CONCAT11(bios->data[lVar20],bios->data[(ulong)peVar14->offset + 0xd]);
            uVar9 = 0;
          }
          else {
            peVar14->disable_spread = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            uVar9 = 0xfffffff2;
          }
          lVar20 = (ulong)peVar14->offset + 0x10;
          if ((uint)lVar20 < bios->length) {
            peVar14->disable_lt =
                 CONCAT11(bios->data[lVar20],bios->data[(ulong)peVar14->offset + 0xf]);
            uVar10 = 0;
          }
          else {
            peVar14->disable_lt = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            uVar10 = 0xfffffff2;
          }
          lVar20 = (ulong)peVar14->offset + 0x11;
          if ((uint)lVar20 < bios->length) {
            peVar14->level_entry_table_index = bios->data[lVar20];
            uVar11 = 0;
          }
          else {
            peVar14->level_entry_table_index = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            uVar11 = 0xfffffff2;
          }
          lVar20 = (ulong)peVar14->offset + 0x12;
          if ((uint)lVar20 < bios->length) {
            peVar14->hbr2_min_vdt_index = bios->data[lVar20];
            uVar12 = 0;
          }
          else {
            peVar14->hbr2_min_vdt_index = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            uVar12 = 0xfffffff2;
          }
          uVar22 = uVar22 | uVar10 | uVar11 | uVar12 |
                            uVar7 | uVar8 | uVar9 | uVar25 | uVar6 | uVar23 | uVar13;
          peVar14->valid = uVar22 == 0;
          uVar23 = 4 - ((bios->d).dp_info.version < 0x42);
          uVar24 = (ulong)uVar23;
          peVar14->before_link_speed_nums = uVar23;
          peVar15 = (envy_bios_d_dp_info_before_link_speed *)malloc((ulong)(uVar23 * 6));
          peVar14->before_link_speed_entries = peVar15;
          lVar20 = 0;
          do {
            peVar15 = peVar14->before_link_speed_entries;
            uVar16 = (ulong)peVar14->before_link_speed_0 + lVar20;
            (&peVar15->offset)[lVar20] = (uint16_t)uVar16;
            if (((uint)uVar16 & 0xffff) < bios->length) {
              (&peVar15->link_rate)[lVar20 * 2] = bios->data[uVar16 & 0xffff];
              uVar23 = 0;
            }
            else {
              (&peVar15->link_rate)[lVar20 * 2] = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
              uVar23 = 0xfffffff2;
            }
            lVar17 = (ulong)(&peVar15->offset)[lVar20] + 2;
            if ((uint)lVar17 < bios->length) {
              (&peVar15->link_rate_ptr)[lVar20] =
                   CONCAT11(bios->data[lVar17],bios->data[(ulong)(&peVar15->offset)[lVar20] + 1]);
              uVar13 = 0;
            }
            else {
              (&peVar15->link_rate_ptr)[lVar20] = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
              uVar13 = 0xfffffff2;
            }
            uVar22 = uVar22 | uVar23 | uVar13;
            (&peVar15->valid)[lVar20 * 2] = uVar22 == 0;
            lVar20 = lVar20 + 3;
            uVar24 = uVar24 - 1;
          } while (uVar24 != 0);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (bios->d).dp_info.entriesnum);
    }
    bVar1 = (bios->d).dp_info.levelentrytables_count;
    peVar18 = (envy_bios_d_dp_info_level_entry_table *)malloc((ulong)bVar1 << 4);
    (bios->d).dp_info.level_entry_tables = peVar18;
    if (bVar1 != 0) {
      uVar21 = 0;
      do {
        peVar18 = (bios->d).dp_info.level_entry_tables;
        bVar1 = (bios->d).dp_info.levelentry_count;
        peVar18[uVar21].offset =
             (ushort)(bios->d).dp_info.levelentry_size * (short)uVar21 * (ushort)bVar1 +
             (ushort)(bios->d).dp_info.rlen * (ushort)(bios->d).dp_info.entriesnum +
             (ushort)(bios->d).dp_info.hlen + (bios->d).dp_info.offset;
        peVar19 = (envy_bios_d_dp_info_level_entry *)malloc((ulong)((uint)bVar1 * 8));
        peVar18[uVar21].level_entries = peVar19;
        bVar26 = bVar1 != 0;
        if (bVar26) {
          uVar24 = 0;
          do {
            peVar19 = peVar18[uVar21].level_entries;
            uVar4 = (short)uVar24 * (ushort)(bios->d).dp_info.levelentry_size +
                    peVar18[uVar21].offset;
            peVar19[uVar24].offset = uVar4;
            bVar1 = (bios->d).dp_info.version;
            if (bVar1 - 0x40 < 2) {
              if ((uint)uVar4 < bios->length) {
                peVar19[uVar24].post_cursor_2 = bios->data[uVar4];
                uVar23 = 0;
              }
              else {
                peVar19[uVar24].post_cursor_2 = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar23 = 0xfffffff2;
              }
              lVar20 = (ulong)peVar19[uVar24].offset + 1;
              if ((uint)lVar20 < bios->length) {
                peVar19[uVar24].drive_current = bios->data[lVar20];
                uVar13 = 0;
              }
              else {
                peVar19[uVar24].drive_current = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar13 = 0xfffffff2;
              }
              lVar20 = (ulong)peVar19[uVar24].offset + 2;
              if ((uint)lVar20 < bios->length) {
                peVar19[uVar24].pre_emphasis = bios->data[lVar20];
                uVar25 = 0;
              }
              else {
                peVar19[uVar24].pre_emphasis = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar25 = 0xfffffff2;
              }
              lVar20 = (ulong)peVar19[uVar24].offset + 3;
              if ((uint)lVar20 < bios->length) {
                peVar19[uVar24].tx_pu = bios->data[lVar20];
                uVar6 = 0;
              }
              else {
                peVar19[uVar24].tx_pu = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar6 = 0xfffffff2;
              }
              uVar25 = uVar23 | uVar13 | uVar25 | uVar6;
LAB_002677e1:
              uVar22 = uVar22 | uVar25;
              peVar19[uVar24].valid = uVar22 == 0;
              bVar3 = true;
            }
            else {
              if (bVar1 == 0x42) {
                peVar19[uVar24].post_cursor_2 = '\0';
                if ((uint)uVar4 < bios->length) {
                  peVar19[uVar24].drive_current = bios->data[uVar4];
                  uVar23 = 0;
                }
                else {
                  peVar19[uVar24].drive_current = '\0';
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                  uVar23 = 0xfffffff2;
                }
                lVar20 = (ulong)peVar19[uVar24].offset + 1;
                if ((uint)lVar20 < bios->length) {
                  peVar19[uVar24].pre_emphasis = bios->data[lVar20];
                  uVar13 = 0;
                }
                else {
                  peVar19[uVar24].pre_emphasis = '\0';
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                  uVar13 = 0xfffffff2;
                }
                lVar20 = (ulong)peVar19[uVar24].offset + 2;
                if ((uint)lVar20 < bios->length) {
                  peVar19[uVar24].tx_pu = bios->data[lVar20];
                  uVar25 = 0;
                }
                else {
                  peVar19[uVar24].tx_pu = '\0';
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                  uVar25 = 0xfffffff2;
                }
                uVar25 = uVar23 | uVar13 | uVar25;
                goto LAB_002677e1;
              }
              bVar3 = false;
              fprintf(_stderr,"Unknown d DP INFO LEVEL ENTRY TABLE version 0x%x\n");
            }
            if (!bVar3) break;
            uVar24 = uVar24 + 1;
            bVar26 = uVar24 < (bios->d).dp_info.levelentry_count;
          } while (bVar26);
        }
      } while ((!bVar26) && (uVar21 = uVar21 + 1, uVar21 < (bios->d).dp_info.levelentrytables_count)
              );
    }
  }
  return 0;
}

Assistant:

int
envy_bios_parse_bit_d(struct envy_bios *bios, struct envy_bios_bit_entry *bit)
{
	struct envy_bios_d *d = &bios->d;
	unsigned int idx = 0;

	d->bit = bit;

	while (!parse_at(bios, idx, NULL))
		idx++;

	/* parse tables */
	envy_bios_parse_d_dp_info(bios);

	return 0;
}